

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

void add_trailing_sep(DString *path)

{
  if ((path->currentStringLength != 0) && (path->str[path->currentStringLength - 1] == '/')) {
    return;
  }
  d_string_append_c(path,'/');
  return;
}

Assistant:

void add_trailing_sep(DString * path) {
#if defined(__WIN32)
	char sep = '\\';
#else
	char sep = '/';
#endif

	// Ensure that folder ends in separator
	if ((path->currentStringLength == 0) || (!is_separator(path->str[path->currentStringLength - 1]))) {
		d_string_append_c(path, sep);
	}
}